

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbtree.c
# Opt level: O2

rb_result_t rb_tree_new_ex(rb_tree *tree,rb_cmp_func_ex_t compare,void *state)

{
  uint __line;
  char *__assertion;
  
  if (tree == (rb_tree *)0x0) {
    __assertion = "\"tree != NULL\" && 0";
    __line = 0x51;
  }
  else {
    if (compare != (rb_cmp_func_ex_t)0x0) {
      tree->root = (rb_tree_node *)0x0;
      tree->compare = compare;
      tree->state = state;
      tree->rightmost = (rb_tree_node *)0x0;
      return 0;
    }
    __assertion = "\"compare != NULL\" && 0";
    __line = 0x52;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/monkey[P]monkey/deps/rbtree/rbtree.c"
                ,__line,"rb_result_t rb_tree_new_ex(struct rb_tree *, rb_cmp_func_ex_t, void *)");
}

Assistant:

rb_result_t rb_tree_new_ex(struct rb_tree *tree,
                           rb_cmp_func_ex_t compare,
                           void *state)
{
    rb_result_t ret = RB_OK;

    RB_ASSERT_ARG(tree != NULL);
    RB_ASSERT_ARG(compare != NULL);

    tree->root = NULL;
    tree->compare = compare;
    tree->state = state;
    tree->rightmost = NULL;

    return ret;
}